

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

String * format<String,int,String,String>
                   (String *__return_storage_ptr__,String *fmtstr,String *raw_args,int *raw_args_1,
                   String *raw_args_2,String *raw_args_3)

{
  size_type sVar1;
  unsigned_long local_70;
  size_type local_68 [3];
  undefined1 local_50 [8];
  vector<String,_std::allocator<String>_> args;
  String *raw_args_local_3;
  String *raw_args_local_2;
  int *raw_args_local_1;
  String *raw_args_local;
  String *fmtstr_local;
  
  args.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = raw_args_3;
  std::vector<String,_std::allocator<String>_>::vector
            ((vector<String,_std::allocator<String>_> *)local_50);
  expandFormatArguments<String,int,String,String>
            ((vector<String,_std::allocator<String>_> *)local_50,raw_args,raw_args_1,raw_args_2,
             args.super__Vector_base<String,_std::allocator<String>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  sVar1 = std::vector<String,_std::allocator<String>_>::size
                    ((vector<String,_std::allocator<String>_> *)local_50);
  if (sVar1 != 4) {
    local_68[0] = std::vector<String,_std::allocator<String>_>::size
                            ((vector<String,_std::allocator<String>_> *)local_50);
    local_70 = 4;
    error<unsigned_long,unsigned_long>
              ("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/format.h:200: args.size() (%1) does not equal sizeof... (raw_args) (%2)"
               ,local_68,&local_70);
  }
  formatArgs(__return_storage_ptr__,fmtstr,(vector<String,_std::allocator<String>_> *)local_50);
  std::vector<String,_std::allocator<String>_>::~vector
            ((vector<String,_std::allocator<String>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

String format (const String& fmtstr, const argtypes&... raw_args)
{
	std::vector<String> args;
	expandFormatArguments (args, raw_args...);
	ASSERT_EQ (args.size(), sizeof... (raw_args))
	return formatArgs (fmtstr, args);
}